

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O1

void __thiscall
Buffer_reserve_space_never_returns_too_much_Test::TestBody
          (Buffer_reserve_space_never_returns_too_much_Test *this)

{
  char *pcVar1;
  AssertionResult gtest_ar;
  bfy_iovec expected_peek;
  bfy_iovec expected_reserve;
  BufferWithLocalArray<64UL> local;
  AssertHelper AStack_1a8;
  internal local_1a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  bfy_iovec local_190;
  bfy_iovec local_180;
  bfy_buffer local_170;
  int8_t local_e8 [64];
  bfy_buffer local_a8;
  
  local_e8[0x30] = '\0';
  local_e8[0x31] = '\0';
  local_e8[0x32] = '\0';
  local_e8[0x33] = '\0';
  local_e8[0x34] = '\0';
  local_e8[0x35] = '\0';
  local_e8[0x36] = '\0';
  local_e8[0x37] = '\0';
  local_e8[0x38] = '\0';
  local_e8[0x39] = '\0';
  local_e8[0x3a] = '\0';
  local_e8[0x3b] = '\0';
  local_e8[0x3c] = '\0';
  local_e8[0x3d] = '\0';
  local_e8[0x3e] = '\0';
  local_e8[0x3f] = '\0';
  local_e8[0x20] = '\0';
  local_e8[0x21] = '\0';
  local_e8[0x22] = '\0';
  local_e8[0x23] = '\0';
  local_e8[0x24] = '\0';
  local_e8[0x25] = '\0';
  local_e8[0x26] = '\0';
  local_e8[0x27] = '\0';
  local_e8[0x28] = '\0';
  local_e8[0x29] = '\0';
  local_e8[0x2a] = '\0';
  local_e8[0x2b] = '\0';
  local_e8[0x2c] = '\0';
  local_e8[0x2d] = '\0';
  local_e8[0x2e] = '\0';
  local_e8[0x2f] = '\0';
  local_e8[0x10] = '\0';
  local_e8[0x11] = '\0';
  local_e8[0x12] = '\0';
  local_e8[0x13] = '\0';
  local_e8[0x14] = '\0';
  local_e8[0x15] = '\0';
  local_e8[0x16] = '\0';
  local_e8[0x17] = '\0';
  local_e8[0x18] = '\0';
  local_e8[0x19] = '\0';
  local_e8[0x1a] = '\0';
  local_e8[0x1b] = '\0';
  local_e8[0x1c] = '\0';
  local_e8[0x1d] = '\0';
  local_e8[0x1e] = '\0';
  local_e8[0x1f] = '\0';
  local_e8[0] = '\0';
  local_e8[1] = '\0';
  local_e8[2] = '\0';
  local_e8[3] = '\0';
  local_e8[4] = '\0';
  local_e8[5] = '\0';
  local_e8[6] = '\0';
  local_e8[7] = '\0';
  local_e8[8] = '\0';
  local_e8[9] = '\0';
  local_e8[10] = '\0';
  local_e8[0xb] = '\0';
  local_e8[0xc] = '\0';
  local_e8[0xd] = '\0';
  local_e8[0xe] = '\0';
  local_e8[0xf] = '\0';
  bfy_buffer_init_unmanaged(&local_170,local_e8,0x40);
  memcpy(&local_a8,&local_170,0x88);
  local_170.page.size = 0x20;
  local_180.iov_len = 0x40;
  local_180.iov_base = local_e8;
  local_170.page.data = local_e8;
  local_190 = bfy_buffer_reserve_space(&local_a8,0x20);
  testing::internal::CmpHelperEQ<bfy_iovec,bfy_iovec>
            (local_1a0,"expected_reserve","bfy_buffer_reserve_space(&local.buf, WantSize)",
             (bfy_iovec *)&local_170,&local_190);
  if (local_1a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_190);
    if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_198->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x422,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_1a8,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&AStack_1a8);
    if ((long *)local_190.iov_base != (long *)0x0) {
      (**(code **)(*local_190.iov_base + 8))();
    }
  }
  if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_198,local_198);
  }
  local_190 = bfy_buffer_peek_space(&local_a8);
  testing::internal::CmpHelperEQ<bfy_iovec,bfy_iovec>
            (local_1a0,"expected_peek","bfy_buffer_peek_space(&local.buf)",&local_180,&local_190);
  if (local_1a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_190);
    if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_198->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x423,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_1a8,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&AStack_1a8);
    if ((long *)local_190.iov_base != (long *)0x0) {
      (**(code **)(*local_190.iov_base + 8))();
    }
  }
  if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_198,local_198);
  }
  bfy_buffer_destruct(&local_a8);
  return;
}

Assistant:

~BufferWithLocalArray() {
        bfy_buffer_destruct(&buf);
    }